

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O1

void __thiscall BrokerSendMessage_SinglePart_Test::TestBody(BrokerSendMessage_SinglePart_Test *this)

{
  bool bVar1;
  uint32_t mid;
  Buffer BVar2;
  TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *this_00;
  ActionInterface<bool_(const_pstore::brokerface::message_type_&)> *impl;
  UI_STRING *uis;
  UI *ui;
  mock_writer wr;
  message_type expected;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  bool *local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  MatcherBase<const_pstore::brokerface::message_type_&> local_1d0;
  _Any_data local_1b8;
  code *local_1a8;
  mock_writer local_198;
  message_type local_110;
  
  anon_unknown.dwarf_540ba::mock_writer::mock_writer(&local_198);
  mid = (this->super_BrokerSendMessage).message_id_;
  local_200._0_8_ = &local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"hello world","");
  pstore::brokerface::message_type::message_type(&local_110,mid,0,1,(string *)local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ != &local_1f0) {
    operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
  }
  local_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171848;
  local_1d0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::ValuePolicy<testing::internal::EqMatcher<pstore::brokerface::message_type>,false>>()
       ::kVTable;
  BVar2.ptr = operator_new(0x104);
  ((BVar2.shared)->ref).super___atomic_base<int>._M_i = 1;
  memcpy((void *)(BVar2.i + 4),&local_110,0x100);
  local_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001717d8;
  local_1d0.buffer_.ptr = BVar2.ptr;
  anon_unknown.dwarf_540ba::mock_writer::gmock_write_impl
            ((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_200,&local_198,
             (Matcher<const_pstore::brokerface::message_type_&> *)&local_1d0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
            InternalExpectedAt((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)
                               local_200,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                               ,0x39,"wr","write_impl (Eq (expected))");
  local_1e0 = (bool *)operator_new(1);
  *local_1e0 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_1d8,local_1e0);
  impl = (ActionInterface<bool_(const_pstore::brokerface::message_type_&)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00171a28;
  bVar1 = *local_1e0;
  *(bool *)&impl[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&impl[1]._vptr_ActionInterface + 1) = bVar1;
  testing::Action<bool_(const_pstore::brokerface::message_type_&)>::Action
            ((Action<bool_(const_pstore::brokerface::message_type_&)> *)&local_1b8,impl);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (this_00,(Action<bool_(const_pstore::brokerface::message_type_&)> *)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
  }
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::message_type_&> *)(local_200 + 8));
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase(&local_1d0)
  ;
  ui = (UI *)0x1;
  pstore::brokerface::send_message(&local_198.super_writer,true,"hello","world");
  local_198.super_writer._vptr_writer = (_func_int **)&PTR__mock_writer_00171628;
  testing::internal::FunctionMocker<bool_(const_pstore::brokerface::message_type_&)>::
  ~FunctionMocker(&local_198.gmock01_write_impl_36);
  pstore::brokerface::writer::~writer(&local_198.super_writer,ui,uis);
  return;
}

Assistant:

TEST_F (BrokerSendMessage, SinglePart) {
    using ::testing::Eq;
    using ::testing::Return;

    mock_writer wr;
    pstore::brokerface::message_type const expected{message_id_, 0, 1, "hello world"};
    EXPECT_CALL (wr, write_impl (Eq (expected))).WillOnce (Return (true));

    pstore::brokerface::send_message (wr, true /*error on timeout*/, "hello", "world");
}